

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtHelper.cpp
# Opt level: O0

void __thiscall JsrtCallbackState::~JsrtCallbackState(JsrtCallbackState *this)

{
  JsrtContext *pJVar1;
  bool bVar2;
  JsrtContext *pJVar3;
  bool isSet_1;
  bool isSet;
  JsrtCallbackState *this_local;
  
  if (this->originalJsrtContext == (JsrtContext *)0x0) {
    bVar2 = ThreadContextTLSEntry::TrySetThreadContext(this->originalThreadContext);
    if (!bVar2) {
      Js::Throw::FatalInternalError(-0x7fffbffb);
    }
  }
  else {
    pJVar1 = this->originalJsrtContext;
    pJVar3 = JsrtContext::GetCurrent();
    if ((pJVar1 != pJVar3) &&
       (bVar2 = JsrtContext::TrySetCurrent(this->originalJsrtContext), !bVar2)) {
      Js::Throw::FatalInternalError(-0x7fffbffb);
    }
  }
  return;
}

Assistant:

JsrtCallbackState::~JsrtCallbackState()
{
    if (originalJsrtContext != nullptr)
    {
        if (originalJsrtContext != JsrtContext::GetCurrent())
        {
            // This shouldn't fail as the context was previously set on the current thread.
            bool isSet = JsrtContext::TrySetCurrent(originalJsrtContext);
            if (!isSet)
            {
                Js::Throw::FatalInternalError();
            }
        }
    }
    else
    {
        bool isSet = ThreadContextTLSEntry::TrySetThreadContext(originalThreadContext);
        if (!isSet)
        {
            Js::Throw::FatalInternalError();
        }
    }
}